

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O0

wchar_t lzx_read_pre_tree(lzx_stream *strm)

{
  wchar_t wVar1;
  ulong uVar2;
  long in_RDI;
  wchar_t i;
  lzx_br *br;
  lzx_dec *ds;
  int local_24;
  lzx_br *br_00;
  lzx_stream *strm_00;
  
  strm_00 = *(lzx_stream **)(in_RDI + 0x30);
  br_00 = (lzx_br *)&strm_00[1].ds;
  if ((int)strm_00[10].total_out == 0) {
    memset((void *)((long)&strm_00[8].avail_out + 4),0,0x44);
  }
  local_24 = (int)strm_00[10].total_out;
  while( true ) {
    if ((int)strm_00[8].avail_out <= local_24) {
      *(int *)&strm_00[10].total_out = local_24;
      return L'\x01';
    }
    if (((br_00->cache_avail < L'\x04') && (wVar1 = lzx_br_fillup(strm_00,br_00), wVar1 == L'\0'))
       && (br_00->cache_avail < L'\x04')) break;
    (strm_00[9].ds)->rbytes[(long)local_24 + -0x4c] =
         (byte)(br_00->cache_buffer >> ((char)br_00->cache_avail - 4U & 0x3f)) & 0xf;
    uVar2 = (ulong)(strm_00[9].ds)->rbytes[(long)local_24 + -0x4c];
    *(int *)((long)&strm_00[8].avail_out + uVar2 * 4 + 4) =
         *(int *)((long)&strm_00[8].avail_out + uVar2 * 4 + 4) + 1;
    br_00->cache_avail = br_00->cache_avail + L'\xfffffffc';
    local_24 = local_24 + 1;
  }
  *(int *)&strm_00[10].total_out = local_24;
  return L'\0';
}

Assistant:

static int
lzx_read_pre_tree(struct lzx_stream *strm)
{
	struct lzx_dec *ds = strm->ds;
	struct lzx_br *br = &(ds->br);
	int i;

	if (ds->loop == 0)
		memset(ds->pt.freq, 0, sizeof(ds->pt.freq));
	for (i = ds->loop; i < ds->pt.len_size; i++) {
		if (!lzx_br_read_ahead(strm, br, 4)) {
			ds->loop = i;
			return (0);
		}
		ds->pt.bitlen[i] = lzx_br_bits(br, 4);
		ds->pt.freq[ds->pt.bitlen[i]]++;
		lzx_br_consume(br, 4);
	}
	ds->loop = i;
	return (1);
}